

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O1

string * __thiscall cmCTestBZR::LoadInfo_abi_cxx11_(string *__return_storage_ptr__,cmCTestBZR *this)

{
  pointer pcVar1;
  char *bzr_revno [3];
  char *bzr_info [3];
  OutputLogger rerr;
  OutputLogger ierr;
  RevnoParser rout;
  InfoParser iout;
  pointer local_3d8;
  char *local_3d0;
  undefined8 local_3c8;
  pointer local_3b8;
  char *local_3b0;
  undefined8 local_3a8;
  OutputLogger local_3a0;
  OutputLogger local_360;
  RevnoParser local_320;
  InfoParser local_208;
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_3b0 = "info";
  local_3a8 = 0;
  local_3b8 = pcVar1;
  InfoParser::InfoParser(&local_208,this,"info-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_360,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"info-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,&local_3b8,(OutputParser *)&local_208,
                      (OutputParser *)&local_360,(char *)0x0,Auto);
  local_3d0 = "revno";
  local_3c8 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_3d8 = pcVar1;
  RevnoParser::RevnoParser(&local_320,this,"revno-out> ",__return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_3a0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"revno-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,&local_3d8,(OutputParser *)&local_320,
                      (OutputParser *)&local_3a0,(char *)0x0,Auto);
  local_3a0.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_009618b8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0.super_LineParser.Line._M_dataplus._M_p !=
      &local_3a0.super_LineParser.Line.field_2) {
    operator_delete(local_3a0.super_LineParser.Line._M_dataplus._M_p,
                    local_3a0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_320.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__RevnoParser_0095e858;
  if (local_320.RegexRevno.program != (char *)0x0) {
    operator_delete__(local_320.RegexRevno.program);
  }
  local_320.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_009618b8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.super_LineParser.Line._M_dataplus._M_p !=
      &local_320.super_LineParser.Line.field_2) {
    operator_delete(local_320.super_LineParser.Line._M_dataplus._M_p,
                    local_320.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_360.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_009618b8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.super_LineParser.Line._M_dataplus._M_p !=
      &local_360.super_LineParser.Line.field_2) {
    operator_delete(local_360.super_LineParser.Line._M_dataplus._M_p,
                    local_360.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_208.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__InfoParser_0095e810;
  if (local_208.RegexParent.program != (char *)0x0) {
    operator_delete__(local_208.RegexParent.program);
  }
  if (local_208.RegexCheckOut.program != (char *)0x0) {
    operator_delete__(local_208.RegexCheckOut.program);
  }
  local_208.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_009618b8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.super_LineParser.Line._M_dataplus._M_p !=
      &local_208.super_LineParser.Line.field_2) {
    operator_delete(local_208.super_LineParser.Line._M_dataplus._M_p,
                    local_208.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestBZR::LoadInfo()
{
  // Run "bzr info" to get the repository info from the work tree.
  const char* bzr = this->CommandLineTool.c_str();
  const char* bzr_info[] = { bzr, "info", nullptr };
  InfoParser iout(this, "info-out> ");
  OutputLogger ierr(this->Log, "info-err> ");
  this->RunChild(bzr_info, &iout, &ierr);

  // Run "bzr revno" to get the repository revision number from the work tree.
  const char* bzr_revno[] = { bzr, "revno", nullptr };
  std::string rev;
  RevnoParser rout(this, "revno-out> ", rev);
  OutputLogger rerr(this->Log, "revno-err> ");
  this->RunChild(bzr_revno, &rout, &rerr);

  return rev;
}